

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_dsc.c
# Opt level: O3

int get_dsc_leb_entries(Dwarf_Debug dbg,Dwarf_Small *blockpointer,Dwarf_Unsigned blocklen,
                       int dounsigned,Dwarf_Dsc_Entry_s *ary,size_t *arraycount,Dwarf_Error *error)

{
  Dwarf_Small *pDVar1;
  undefined8 *puVar2;
  int iVar3;
  Dwarf_Signed *pDVar4;
  char *msg;
  Dwarf_Signed *pDVar5;
  Dwarf_Signed *pDVar6;
  Dwarf_Small *pDVar7;
  Dwarf_Unsigned *pDVar8;
  Dwarf_Unsigned lu_leblen;
  Dwarf_Unsigned local_78;
  Dwarf_Signed *local_70;
  Dwarf_Debug local_68;
  Dwarf_Small *local_60;
  Dwarf_Signed *local_58;
  Dwarf_Signed *local_50;
  undefined8 *local_48;
  Dwarf_Dsc_Entry_s *local_40;
  size_t *local_38;
  
  puVar2 = (undefined8 *)*arraycount;
  if (ary == (Dwarf_Dsc_Entry_s *)0x0) {
    if (puVar2 != (undefined8 *)0x0) goto LAB_00159784;
  }
  else if (puVar2 == (undefined8 *)0x0) goto LAB_00159784;
  pDVar1 = blockpointer + blocklen;
  local_68 = dbg;
  local_60 = pDVar1;
  local_48 = puVar2;
  local_40 = ary;
  local_38 = arraycount;
  if (dounsigned == 0) {
    if ((long)blocklen < 1) goto LAB_00159764;
    pDVar5 = &ary->dsc_high_s;
    pDVar6 = (Dwarf_Signed *)0x0;
    do {
      dbg = local_68;
      if (local_48 <= pDVar6 && local_40 != (Dwarf_Dsc_Entry_s *)0x0) goto LAB_00159784;
      local_78 = 0;
      local_70 = (Dwarf_Signed *)0x0;
      local_50 = pDVar5;
      iVar3 = dwarf_decode_signed_leb128
                        ((char *)blockpointer,&local_78,(Dwarf_Signed *)&local_70,(char *)pDVar1);
      if (iVar3 == 1) {
LAB_001597a0:
        msg = "DW_DLE_LEB_IMPROPER: decode sleb w/len  runs past allowed area.f";
        goto LAB_001597a7;
      }
      pDVar7 = blockpointer + local_78;
      local_58 = local_70;
      if (local_70 != (Dwarf_Signed *)0x0) {
        local_78 = 0;
        local_70 = (Dwarf_Signed *)0x0;
        iVar3 = dwarf_decode_signed_leb128
                          ((char *)pDVar7,&local_78,(Dwarf_Signed *)&local_70,(char *)pDVar1);
        pDVar5 = local_70;
        if (iVar3 != 1) {
          pDVar7 = pDVar7 + local_78;
          local_78 = 0;
          local_70 = (Dwarf_Signed *)0x0;
          iVar3 = dwarf_decode_signed_leb128
                            ((char *)pDVar7,&local_78,(Dwarf_Signed *)&local_70,(char *)pDVar1);
          if (iVar3 != 1) {
            blockpointer = pDVar7 + local_78;
            pDVar4 = local_70;
            goto LAB_00159725;
          }
        }
        goto LAB_001597a0;
      }
      local_78 = 0;
      local_70 = (Dwarf_Signed *)0x0;
      iVar3 = dwarf_decode_signed_leb128
                        ((char *)pDVar7,&local_78,(Dwarf_Signed *)&local_70,(char *)pDVar1);
      if (iVar3 == 1) goto LAB_001597a0;
      blockpointer = pDVar7 + local_78;
      pDVar4 = (Dwarf_Signed *)0x0;
      pDVar5 = local_70;
LAB_00159725:
      if (local_40 != (Dwarf_Dsc_Entry_s *)0x0) {
        ((Dwarf_Dsc_Entry_s *)(local_50 + -4))->dsc_type = (Dwarf_Half)local_58;
        local_50[-1] = (Dwarf_Signed)pDVar5;
        *local_50 = (Dwarf_Signed)pDVar4;
      }
      pDVar6 = (Dwarf_Signed *)((long)pDVar6 + 1);
      pDVar5 = local_50 + 5;
    } while (blockpointer < pDVar1);
  }
  else if ((long)blocklen < 1) {
LAB_00159764:
    pDVar6 = (Dwarf_Signed *)0x0;
  }
  else {
    pDVar8 = &ary->dsc_high_u;
    pDVar6 = (Dwarf_Signed *)0x0;
    do {
      dbg = local_68;
      if (local_48 <= pDVar6 && local_40 != (Dwarf_Dsc_Entry_s *)0x0) goto LAB_00159784;
      local_78 = 0;
      local_70 = (Dwarf_Signed *)0x0;
      iVar3 = dwarf_decode_leb128((char *)blockpointer,&local_78,(Dwarf_Unsigned *)&local_70,
                                  (char *)local_60);
      pDVar1 = local_60;
      if (iVar3 == 1) goto LAB_0015978b;
      pDVar7 = blockpointer + local_78;
      local_50 = local_70;
      if (local_70 == (Dwarf_Signed *)0x0) {
        local_78 = 0;
        local_70 = (Dwarf_Signed *)0x0;
        iVar3 = dwarf_decode_leb128((char *)pDVar7,&local_78,(Dwarf_Unsigned *)&local_70,
                                    (char *)local_60);
        if (iVar3 == 1) goto LAB_0015978b;
        blockpointer = pDVar7 + local_78;
        pDVar4 = (Dwarf_Signed *)0x0;
        pDVar5 = local_70;
      }
      else {
        local_78 = 0;
        local_70 = (Dwarf_Signed *)0x0;
        local_58 = pDVar6;
        iVar3 = dwarf_decode_leb128((char *)pDVar7,&local_78,(Dwarf_Unsigned *)&local_70,
                                    (char *)local_60);
        pDVar5 = local_70;
        if (iVar3 == 1) {
LAB_0015978b:
          msg = "DW_DLE_LEB_IMPROPER: decode uleb runs past allowed area.c";
LAB_001597a7:
          _dwarf_error_string(local_68,error,0x149,msg);
          return 1;
        }
        pDVar7 = pDVar7 + local_78;
        local_78 = 0;
        local_70 = (Dwarf_Signed *)0x0;
        iVar3 = dwarf_decode_leb128((char *)pDVar7,&local_78,(Dwarf_Unsigned *)&local_70,
                                    (char *)pDVar1);
        if (iVar3 == 1) goto LAB_0015978b;
        blockpointer = pDVar7 + local_78;
        pDVar4 = local_70;
        pDVar6 = local_58;
      }
      if (local_40 != (Dwarf_Dsc_Entry_s *)0x0) {
        ((Dwarf_Dsc_Entry_s *)(pDVar8 + -2))->dsc_type = (Dwarf_Half)local_50;
        pDVar8[-1] = (Dwarf_Unsigned)pDVar5;
        *pDVar8 = (Dwarf_Unsigned)pDVar4;
      }
      pDVar6 = (Dwarf_Signed *)((long)pDVar6 + 1);
      pDVar8 = pDVar8 + 5;
    } while (blockpointer < pDVar1);
  }
  if (local_40 == (Dwarf_Dsc_Entry_s *)0x0) {
    *local_38 = (size_t)pDVar6;
    return 0;
  }
  dbg = local_68;
  if (local_48 == pDVar6) {
    return 0;
  }
LAB_00159784:
  _dwarf_error(dbg,error,0x161);
  return 1;
}

Assistant:

static int
get_dsc_leb_entries(Dwarf_Debug dbg,
    Dwarf_Small    * blockpointer,
    Dwarf_Unsigned   blocklen,
    int dounsigned,
    struct Dwarf_Dsc_Entry_s *ary,
    size_t         * arraycount,
    Dwarf_Error    * error)
{
    Dwarf_Small *p = blockpointer;
    Dwarf_Small *endp = blockpointer + blocklen;
    size_t larraycount = 0;
    size_t iarraycount = *arraycount;

    if (!ary) {
        if (iarraycount) {
            /* Internal botch calling this static function. */
            _dwarf_error(dbg, error, DW_DLE_DISCR_ARRAY_ERROR);
            return DW_DLV_ERROR;
        } else {}
    } else {
        if (!iarraycount) {
            /* Internal botch calling this static function. */
            _dwarf_error(dbg, error, DW_DLE_DISCR_ARRAY_ERROR);
            return DW_DLV_ERROR;
        } else {}
    }
    if (dounsigned) {
        while (p < endp)  {
            Dwarf_Unsigned dsc = 0;
            Dwarf_Unsigned low = 0;
            Dwarf_Unsigned high = 0;

            if (ary && (larraycount >= iarraycount)) {
                _dwarf_error(dbg, error, DW_DLE_DISCR_ARRAY_ERROR);
                return DW_DLV_ERROR;
            }
            DECODE_LEB128_UWORD_CK(p,dsc,
                dbg,error,endp);
            if (!dsc) {
                DECODE_LEB128_UWORD_CK(p,low,
                    dbg,error,endp);
            } else {
                DECODE_LEB128_UWORD_CK(p,low,
                    dbg,error,endp);
                DECODE_LEB128_UWORD_CK(p,high,
                    dbg,error,endp);
            }
            if (ary) {
                struct Dwarf_Dsc_Entry_s *arye =
                    ary+larraycount;

                /*  type reads the same as uleb and leb because
                    it is only zero or one. */
                arye->dsc_type = (Dwarf_Half)dsc;
                arye->dsc_low_u = low;
                arye->dsc_high_u = high;
            }
            larraycount++;
        }
    } else {
        while (p < endp)  {
            Dwarf_Signed dsc = 0;
            Dwarf_Signed low = 0;
            Dwarf_Signed high = 0;
            Dwarf_Unsigned leblen = 0;

            (void)leblen;
            if (ary && (larraycount >= iarraycount)) {
                _dwarf_error(dbg, error, DW_DLE_DISCR_ARRAY_ERROR);
                return DW_DLV_ERROR;
            }
            DECODE_LEB128_SWORD_LEN_CK(p,dsc,
                leblen,dbg,error,endp);
            if (!dsc) {
                DECODE_LEB128_SWORD_LEN_CK(p,low,
                    leblen,dbg,error,endp);
            } else {
                DECODE_LEB128_SWORD_LEN_CK(p,low,
                    leblen,dbg,error,endp);
                DECODE_LEB128_SWORD_LEN_CK(p,high,
                    leblen,dbg,error,endp);
            }
            if (ary) {
                struct Dwarf_Dsc_Entry_s *arye =
                    ary+larraycount;

                /*  type reads the same as uleb and leb because
                    it is only zero or one. */
                arye->dsc_type = (Dwarf_Half)dsc;
                arye->dsc_low_s = low;
                arye->dsc_high_s = high;
            }
            larraycount++;
        }
    }
    if (ary) {
        /*  Just verify this recount matches original */
        if (iarraycount != larraycount) {
            _dwarf_error(dbg, error, DW_DLE_DISCR_ARRAY_ERROR);
            return DW_DLV_ERROR;
        }
    } else {
        /*  This matters for first call with
            ary 0 and iarraycount 0 as we are generating the
            count. */
        *arraycount = larraycount;
    }
    return DW_DLV_OK;
}